

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_mul(m256v *A,m256v *B,m256v *AB_out)

{
  uint8_t b;
  uint8_t a;
  int e;
  long lVar1;
  int j;
  long lVar2;
  uint8_t x;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 < AB_out->n_row; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 < AB_out->n_col; lVar2 = lVar2 + 1) {
      a = '\0';
      for (lVar1 = 0; lVar1 < A->n_col; lVar1 = lVar1 + 1) {
        b = gf256_mul(A->e[lVar1 + A->rstride * lVar3],B->e[lVar2 + B->rstride * lVar1]);
        a = gf256_add(a,b);
      }
      AB_out->e[lVar2 + AB_out->rstride * lVar3] = a;
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}